

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableWidgetPrivate::emitItemEntered(QTableWidgetPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  QTableModel *this_00;
  QTableWidgetItem *pQVar2;
  long in_FS_OFFSET;
  QTableWidgetItem *local_48;
  int local_3c;
  void *local_38;
  undefined1 *local_30;
  int *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  pQVar2 = QTableModel::item(this_00,index);
  if (pQVar2 != (QTableWidgetItem *)0x0) {
    local_38 = (void *)0x0;
    local_48 = pQVar2;
    local_30 = (undefined1 *)&local_48;
    QMetaObject::activate(pQVar1,&QTableWidget::staticMetaObject,4,&local_38);
  }
  local_3c = index->c;
  local_48 = (QTableWidgetItem *)CONCAT44(local_48._4_4_,index->r);
  local_28 = &local_3c;
  local_38 = (void *)0x0;
  local_30 = (undefined1 *)&local_48;
  QMetaObject::activate(pQVar1,&QTableWidget::staticMetaObject,0xc,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetPrivate::emitItemEntered(const QModelIndex &index)
{
    Q_Q(QTableWidget);
    if (QTableWidgetItem *item = tableModel()->item(index))
        emit q->itemEntered(item);
    emit q->cellEntered(index.row(), index.column());
}